

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::PackedEnumParser
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_int *is_valid,
                 InternalMetadataWithArenaLite *metadata,int field_num)

{
  anon_class_32_4_ecc0e51b add;
  char *pcVar1;
  undefined8 in_R8;
  undefined4 in_R9D;
  EpsCopyInputStream *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  add.is_valid._0_4_ = in_R9D;
  add.object = (void *)in_R8;
  add.is_valid._4_4_ = in_stack_ffffffffffffffcc;
  add.metadata._0_4_ = in_stack_ffffffffffffffd0;
  add.metadata._4_4_ = in_R9D;
  add._24_8_ = in_R8;
  pcVar1 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::PackedEnumParser(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(int),google::protobuf::internal::InternalMetadataWithArenaLite*,int)::__0>
                     (in_stack_ffffffffffffffa8,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_R9D),
                      add);
  return pcVar1;
}

Assistant:

const char* PackedEnumParser(void* object, const char* ptr, ParseContext* ctx,
                             bool (*is_valid)(int),
                             InternalMetadataWithArenaLite* metadata,
                             int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, metadata, field_num](uint64 val) {
        if (is_valid(val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}